

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O0

void __thiscall ByteArray::replaceWord(ByteArray *this,size_t pos,uint w,Endianness endianness)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  uchar *d;
  Endianness endianness_local;
  uint w_local;
  size_t pos_local;
  ByteArray *this_local;
  
  sVar2 = size(this);
  if (pos + 1 < sVar2) {
    pbVar3 = data(this,0);
    bVar1 = (byte)(w >> 8);
    if (endianness == Little) {
      pbVar3[pos] = (byte)w;
      pbVar3[pos + 1] = bVar1;
    }
    else {
      pbVar3[pos] = bVar1;
      pbVar3[pos + 1] = (byte)w;
    }
  }
  return;
}

Assistant:

void replaceWord(size_t pos, unsigned int w, Endianness endianness = Endianness::Little)
	{
		if (pos+1 >= this->size()) return;
		unsigned char* d = (unsigned char*) this->data();

		if (endianness == Endianness::Little)
		{
			d[pos+0] = w & 0xFF;
			d[pos+1] = (w >> 8) & 0xFF;
		} else {
			d[pos+0] = (w >> 8) & 0xFF;
			d[pos+1] = w & 0xFF;
		}
	}